

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

RegSlot __thiscall
ByteCodeGenerator::DefineOneFunction
          (ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc,FuncInfo *funcInfoParent,
          bool generateAssignment,RegSlot regEnv,RegSlot frameDisplayTemp)

{
  ushort uVar1;
  FunctionBody *this_00;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  Symbol *this_01;
  uint index;
  FuncInfo *extraout_RDX;
  FuncInfo *extraout_RDX_00;
  FuncInfo *extraout_RDX_01;
  FuncInfo *extraout_RDX_02;
  FuncInfo *extraout_RDX_03;
  FuncInfo *extraout_RDX_04;
  FuncInfo *pFVar6;
  FuncInfo *extraout_RDX_05;
  
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x4c9,"(pnodeFnc->nop == knopFncDecl)","pnodeFnc->nop == knopFncDecl");
    if (!bVar3) goto LAB_007fb025;
    *puVar5 = 0;
  }
  FuncInfo::AcquireLoc(funcInfoParent,&pnodeFnc->super_ParseNode);
  if (regEnv == 0xffffffff) {
    if ((frameDisplayTemp == 0xffffffff) &&
       (frameDisplayTemp = funcInfoParent->frameDisplayRegister, frameDisplayTemp == 0xffffffff)) {
      frameDisplayTemp = FuncInfo::GetEnvRegister(funcInfoParent);
    }
    regEnv = PrependLocalScopes(this,frameDisplayTemp,0xffffffff,funcInfoParent);
  }
  if (pnodeFnc->nestedIndex == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x4e7,"(pnodeFnc->nestedIndex != (uint)-1)",
                       "pnodeFnc->nestedIndex != (uint)-1");
    if (!bVar3) goto LAB_007fb025;
    *puVar5 = 0;
  }
  if (regEnv == funcInfoParent->frameDisplayRegister) {
    index = pnodeFnc->nestedIndex;
LAB_007fadef:
    Js::ByteCodeWriter::NewFunction
              (&this->m_writer,(pnodeFnc->super_ParseNode).location,index,
               (pnodeFnc->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone,
               pnodeFnc->homeObjLocation);
  }
  else {
    RVar4 = FuncInfo::GetEnvRegister(funcInfoParent);
    index = pnodeFnc->nestedIndex;
    if (regEnv == RVar4) goto LAB_007fadef;
    Js::ByteCodeWriter::NewInnerFunction
              (&this->m_writer,(pnodeFnc->super_ParseNode).location,index,regEnv,
               (pnodeFnc->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone,
               pnodeFnc->homeObjLocation);
  }
  bVar3 = FuncInfo::IsGlobalFunction(funcInfoParent);
  pFVar6 = extraout_RDX;
  if ((bVar3) && ((this->flags & 0x400) != 0)) {
    this->funcEscapes = true;
  }
  else {
    if ((pnodeFnc->fncFlags & kFunctionDeclaration) == kFunctionNone) goto LAB_007fafde;
    this_01 = ParseNodeFnc::GetFuncSymbol(pnodeFnc);
    pFVar6 = extraout_RDX_00;
    if (this_01 == (Symbol *)0x0) goto LAB_007fafde;
    if ((funcInfoParent->bodyScope == (Scope *)0x0) || (this_01->scope == (Scope *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x511,
                         "(funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr)"
                         ,
                         "funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr"
                        );
      if (!bVar3) goto LAB_007fb025;
      *puVar5 = 0;
    }
    uVar1 = *(ushort *)&this_01->field_0x42;
    bVar3 = ShouldTrackDebuggerMetadata(this);
    pFVar6 = extraout_RDX_01;
    if (bVar3) {
      bVar3 = FuncInfo::IsGlobalFunction(funcInfoParent);
      pFVar6 = extraout_RDX_02;
      if ((uVar1 & 2) == 0 && bVar3) goto LAB_007fafde;
      bVar3 = Symbol::IsInSlot(this_01,this,funcInfoParent,false);
      pFVar6 = extraout_RDX_03;
      if (!bVar3) {
        this_00 = (FunctionBody *)funcInfoParent->byteCodeFunction;
        bVar3 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)this_00);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
          if (!bVar3) {
LAB_007fb025:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        Js::FunctionBody::InsertSymbolToRegSlotList
                  (this_00,&this_01->name,(pnodeFnc->super_ParseNode).location,
                   funcInfoParent->varRegsCount);
        pFVar6 = extraout_RDX_04;
      }
    }
    if ((uVar1 & 2) != 0) {
      TrackFunctionDeclarationPropertyForDebugger(this,this_01,funcInfoParent);
      pFVar6 = extraout_RDX_05;
    }
  }
LAB_007fafde:
  if ((pnodeFnc->fncFlags & kFunctionIsDefaultModuleExport) != kFunctionNone) {
    EmitAssignmentToDefaultModuleExport(this,&pnodeFnc->super_ParseNode,pFVar6);
  }
  if (generateAssignment && pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
    EmitAssignmentToFuncName(pnodeFnc,this,funcInfoParent);
  }
  return regEnv;
}

Assistant:

Js::RegSlot ByteCodeGenerator::DefineOneFunction(ParseNodeFnc *pnodeFnc, FuncInfo *funcInfoParent, bool generateAssignment, Js::RegSlot regEnv, Js::RegSlot frameDisplayTemp)
{
    Assert(pnodeFnc->nop == knopFncDecl);

    funcInfoParent->AcquireLoc(pnodeFnc);

    if (regEnv == Js::Constants::NoRegister)
    {
        // If the child needs a closure, find a heap-allocated frame to pass to it.
        if (frameDisplayTemp != Js::Constants::NoRegister)
        {
            // We allocated a temp to hold a local frame display value. Use that.
            // It's likely that the FD is on the stack, and we used the temp to load it back.
            regEnv = frameDisplayTemp;
        }
        else if (funcInfoParent->frameDisplayRegister != Js::Constants::NoRegister)
        {
            // This function has built a frame display, so pass it down.
            regEnv = funcInfoParent->frameDisplayRegister;
        }
        else
        {
            // This function has no captured locals but inherits a closure environment, so pass it down.
            regEnv = funcInfoParent->GetEnvRegister();
        }

        regEnv = this->PrependLocalScopes(regEnv, Js::Constants::NoRegister, funcInfoParent);
    }

    // AssertMsg(funcInfo->nonLocalSymbols == 0 || regEnv != funcInfoParent->nullConstantRegister,
    // "We need a closure for the nested function");

    Assert(pnodeFnc->nestedIndex != (uint)-1);

    // If we are in a parameter scope and it is not merged with body scope then we have to create the child function as an inner function
    if (regEnv == funcInfoParent->frameDisplayRegister || regEnv == funcInfoParent->GetEnvRegister())
    {
        m_writer.NewFunction(pnodeFnc->location, pnodeFnc->nestedIndex, pnodeFnc->IsCoroutine(), pnodeFnc->GetHomeObjLocation());
    }
    else
    {
        m_writer.NewInnerFunction(pnodeFnc->location, pnodeFnc->nestedIndex, regEnv, pnodeFnc->IsCoroutine(), pnodeFnc->GetHomeObjLocation());
    }

    if (funcInfoParent->IsGlobalFunction() && (this->flags & fscrEval))
    {
        // A function declared at global scope in eval is untrackable,
        // so make sure the caller's cached scope is invalidated.
        this->funcEscapes = true;
    }
    else
    {
        if (pnodeFnc->IsDeclaration())
        {
            Symbol * funcSymbol = pnodeFnc->GetFuncSymbol();
            if (funcSymbol)
            {
                // In the case where a let/const declaration is the same symbol name
                // as the function declaration (shadowing case), the let/const var and
                // the function declaration symbol are the same and share the same flags
                // (particularly, sym->GetIsBlockVar() for this code path).
                //
                // For example:
                // let a = 0;       // <-- sym->GetIsBlockVar() = true
                // function b(){}   // <-- sym2->GetIsBlockVar() = false
                //
                // let x = 0;       // <-- sym3->GetIsBlockVar() = true
                // function x(){}   // <-- sym3->GetIsBlockVar() = true
                //
                // In order to tell if the function is actually part
                // of a block scope, we compare against the function scope here.
                // Note that having a function with the same name as a let/const declaration
                // is a redeclaration error, but we're pushing the fix for this out since it's
                // a bit involved.
                Assert(funcInfoParent->GetBodyScope() != nullptr && funcSymbol->GetScope() != nullptr);
                bool isFunctionDeclarationInBlock = funcSymbol->GetIsBlockVar();

                // Track all vars/lets/consts register slot function declarations.
                if (ShouldTrackDebuggerMetadata()
                    // If this is a let binding function declaration at global level, we want to
                    // be sure to track the register location as well.
                    && !(funcInfoParent->IsGlobalFunction() && !isFunctionDeclarationInBlock))
                {
                    if (!funcSymbol->IsInSlot(this, funcInfoParent))
                    {
                        funcInfoParent->byteCodeFunction->GetFunctionBody()->InsertSymbolToRegSlotList(funcSymbol->GetName(), pnodeFnc->location, funcInfoParent->varRegsCount);
                    }
                }

                if (isFunctionDeclarationInBlock)
                {
                    // We only track inner let bindings for the debugger side.
                    this->TrackFunctionDeclarationPropertyForDebugger(funcSymbol, funcInfoParent);
                }
            }
        }
    }

    if (pnodeFnc->IsDefaultModuleExport())
    {
        this->EmitAssignmentToDefaultModuleExport(pnodeFnc, funcInfoParent);
    }

    if (pnodeFnc->pnodeName == nullptr || !generateAssignment)
    {
        return regEnv;
    }

    EmitAssignmentToFuncName(pnodeFnc, this, funcInfoParent);

    return regEnv;
}